

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O1

SchemaResolution
avro::anon_unknown_31::checkUnionMatch(NodePtr *writer,NodePtr *reader,size_t *index)

{
  SchemaResolution SVar1;
  int iVar2;
  int iVar3;
  SchemaResolution SVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  SchemaResolution SVar6;
  bool bVar7;
  
  *index = 0;
  iVar2 = (*reader->px->_vptr_Node[4])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    SVar6 = RESOLVE_NO_MATCH;
  }
  else {
    SVar6 = RESOLVE_NO_MATCH;
    uVar5 = 0;
    do {
      iVar3 = (*reader->px->_vptr_Node[5])(reader->px,uVar5 & 0xffffffff);
      SVar4 = (*writer->px->_vptr_Node[0xc])
                        (writer->px,*(undefined8 *)CONCAT44(extraout_var_00,iVar3));
      SVar1 = RESOLVE_MATCH;
      if ((SVar4 == RESOLVE_MATCH) || (SVar1 = SVar4, SVar6 == RESOLVE_NO_MATCH)) {
        SVar6 = SVar1;
        *index = uVar5;
      }
    } while ((SVar4 != RESOLVE_MATCH) &&
            (bVar7 = CONCAT44(extraout_var,iVar2) - 1U != uVar5, uVar5 = uVar5 + 1, bVar7));
  }
  return SVar6;
}

Assistant:

SchemaResolution    
checkUnionMatch(const NodePtr &writer, const NodePtr &reader, size_t &index)
{
    SchemaResolution bestMatch = RESOLVE_NO_MATCH;
 
    index = 0;
    size_t leaves = reader->leaves();

    for(size_t i=0; i < leaves; ++i) {

        const NodePtr &leaf = reader->leafAt(i);
        SchemaResolution newMatch = writer->resolve(*leaf);

        if(newMatch == RESOLVE_MATCH) {
            bestMatch = newMatch;
            index = i;
            break;
        }
        if(bestMatch == RESOLVE_NO_MATCH) {
            bestMatch = newMatch;
            index = i;
        }
    }

    return bestMatch;
}